

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR lys_compile_node_list(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  byte *pbVar1;
  LY_VECODE code;
  LY_ERR LVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  lysp_ext_instance *plVar6;
  lysp_ext_instance *plVar7;
  char *pcVar8;
  ushort **ppuVar9;
  lysc_node *plVar10;
  lysc_node *plVar11;
  lys_module *plVar12;
  ushort uVar13;
  long lVar14;
  lysc_node *plVar15;
  bool bVar16;
  lysc_node **pplVar17;
  lysp_node *plVar18;
  lysp_ext_instance **pplVar19;
  lysp_restr *must_p;
  ly_ctx *plVar20;
  ulong uVar21;
  long lVar22;
  size_t sVar23;
  lysp_node *__s;
  lysp_node **pplVar24;
  lysp_node *plVar25;
  long lVar26;
  size_t local_d8;
  char *local_c8;
  char *id;
  long local_b8;
  ly_ctx *local_b0;
  lysp_node *local_a8;
  lysc_node *local_a0;
  uint local_94;
  long *local_90;
  lysp_node **local_88;
  size_t name_len;
  char *name;
  long *local_70;
  lysp_ext_instance *local_68;
  long local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  char *prefix;
  lysp_node *local_48;
  void *local_40;
  ulong local_38;
  
  iVar3._0_2_ = pnode[2].nodetype;
  iVar3._2_2_ = pnode[2].flags;
  *(int *)&node[1].dsc = iVar3;
  if (iVar3 != 0) {
    *(byte *)&node->flags = (byte)node->flags | 0x20;
  }
  *(uint *)((long)&node[1].dsc + 4) =
       -(uint)(*(uint *)&pnode[2].field_0xc == 0) | *(uint *)&pnode[2].field_0xc;
  pplVar24 = (lysp_node **)&pnode[1].ref;
  while (plVar18 = *pplVar24, plVar18 != (lysp_node *)0x0) {
    LVar2 = lys_compile_node(ctx,plVar18,node,0,(ly_set *)0x0);
    pplVar24 = &plVar18->next;
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
  }
  plVar18 = pnode[1].parent;
  if (plVar18 != (lysp_node *)0x0) {
    plVar12 = node[1].module;
    if (plVar12 == (lys_module *)0x0) {
      plVar5 = (long *)calloc(1,(long)plVar18[-1].exts * 0x38 + 8);
      if (plVar5 == (long *)0x0) goto LAB_00147e2d;
      lVar14 = 0;
      lVar26 = 0;
    }
    else {
      lVar26 = *(long *)&plVar12[-1].implemented;
      plVar5 = (long *)realloc(&plVar12[-1].implemented,
                               ((long)&(plVar18[-1].exts)->name + lVar26 * 2) * 0x38 + 8);
      if (plVar5 == (long *)0x0) {
LAB_00147e2d:
        plVar20 = ctx->ctx;
        pcVar8 = "lys_compile_node_list";
LAB_00147e44:
        ly_log(plVar20,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",pcVar8);
        return LY_EMEM;
      }
      lVar14 = *plVar5;
    }
    node[1].module = (lys_module *)(plVar5 + 1);
    if (pnode[1].parent == (lysp_node *)0x0) {
      plVar6 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar6 = pnode[1].parent[-1].exts;
    }
    lVar22 = 0;
    memset(plVar5 + lVar14 * 7 + 1,0,((long)&plVar6->name + lVar26) * 0x38);
    plVar6 = (lysp_ext_instance *)0xffffffffffffffff;
    while( true ) {
      plVar18 = pnode[1].parent;
      if (plVar18 == (lysp_node *)0x0) {
        plVar7 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar7 = plVar18[-1].exts;
      }
      plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
      if (plVar7 <= plVar6) break;
      plVar12 = node[1].module;
      lVar26 = *(long *)&plVar12[-1].implemented;
      *(long *)&plVar12[-1].implemented = lVar26 + 1;
      must_p = (lysp_restr *)((long)&plVar18->parent + lVar22);
      lVar22 = lVar22 + 0x40;
      LVar2 = lys_compile_must(ctx,must_p,(lysc_must *)(&plVar12->ctx + lVar26 * 7));
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
  }
  LVar2 = lysc_unres_must_add(ctx,node,pnode);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if ((node->flags & 1) != 0) {
    plVar10 = node;
    if ((ctx->compile_opts & 1) == 0) {
LAB_00147eec:
      if ((pnode[1].next == (lysp_node *)0x0) || (*(char *)&(pnode[1].next)->parent == '\0')) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                "Missing key in list representing configuration data.");
        return LY_EVALID;
      }
    }
    else {
      do {
        if ((plVar10->flags & 0x800) != 0) goto LAB_00147eec;
        pplVar17 = &plVar10->parent;
        plVar10 = *pplVar17;
      } while (*pplVar17 != (lysc_node *)0x0);
    }
  }
  plVar18 = pnode[1].next;
  if (plVar18 == (lysp_node *)0x0) {
    node->flags = node->flags & 0xfd3f | 0x240;
  }
  plVar10 = (lysc_node *)0x0;
  local_a8 = pnode;
  while (plVar18 != (lysp_node *)0x0) {
    local_a0 = plVar10;
    pcVar8 = strpbrk((char *)plVar18," \t\n");
    if (pcVar8 == (char *)0x0) {
      sVar23 = strlen((char *)plVar18);
      plVar25 = (lysp_node *)0x0;
    }
    else {
      ppuVar9 = __ctype_b_loc();
      plVar25 = (lysp_node *)(pcVar8 + -1);
      do {
        pplVar24 = &plVar25->parent;
        plVar25 = (lysp_node *)((long)&plVar25->parent + 1);
      } while ((*(byte *)((long)*ppuVar9 + (long)*(char *)((long)pplVar24 + 1) * 2 + 1) & 0x20) != 0
              );
      sVar23 = (long)pcVar8 - (long)plVar18;
    }
    plVar10 = lys_find_child(node,node->module,(char *)plVar18,sVar23,4,2);
    if (plVar10 == (lysc_node *)0x0) {
      plVar20 = ctx->ctx;
      pcVar8 = "The list\'s key \"%.*s\" not found.";
      code = LYVE_REFERENCE;
LAB_0014868e:
      ly_vlog(plVar20,(char *)0x0,code,pcVar8,sVar23 & 0xffffffff,plVar18);
      return LY_EVALID;
    }
    if ((plVar10->flags & 0x100) != 0) {
      plVar20 = ctx->ctx;
      pcVar8 = "Duplicated key identifier \"%.*s\".";
      code = LYVE_SEMANTICS;
      goto LAB_0014868e;
    }
    lysc_update_path(ctx,node->module,plVar10->name);
    if (((plVar10->flags ^ node->flags) & 3) != 0) {
      plVar20 = ctx->ctx;
      pcVar8 = "Key of a configuration list must not be a state leaf.";
LAB_001486c2:
      ly_vlog(plVar20,(char *)0x0,LYVE_SEMANTICS,pcVar8);
      return LY_EVALID;
    }
    if (ctx->pmod->version < 2) {
      if (*(int *)&(plVar10[1].parent)->next == 10) {
        plVar20 = ctx->ctx;
        pcVar8 = "List key of the \"empty\" type is allowed only in YANG 1.1 modules.";
        goto LAB_001486c2;
      }
    }
    else if (plVar10[1].module != (lys_module *)0x0) {
      plVar20 = ctx->ctx;
      pcVar8 = "List\'s key must not have any \"when\" statement.";
      goto LAB_001486c2;
    }
    LVar2 = lysc_check_status(ctx,node->flags,node->module,node->name,plVar10->flags,plVar10->module
                              ,plVar10->name);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    if (plVar10[1].prev != (lysc_node *)0x0) {
      (**(code **)((plVar10[1].prev)->module->revision + 0x38))(ctx->ctx);
      lysc_type_free(&ctx->free_ctx,(lysc_type *)(plVar10[1].prev)->module);
      free(plVar10[1].prev);
      plVar10[1].prev = (lysc_node *)0x0;
    }
    pbVar1 = (byte *)((long)&plVar10->flags + 1);
    *pbVar1 = *pbVar1 | 1;
    plVar11 = plVar10->prev;
    if (local_a0 == (lysc_node *)0x0) {
      if (plVar11->next != (lysc_node *)0x0) goto LAB_001480a4;
    }
    else if (local_a0 != plVar11) {
LAB_001480a4:
      plVar15 = plVar10->next;
      if (plVar15 == (lysc_node *)0x0) {
        plVar15 = *(lysc_node **)(node + 1);
      }
      plVar15->prev = plVar11;
      if (plVar10->prev->next != (lysc_node *)0x0) {
        plVar10->prev->next = plVar10->next;
      }
      if (local_a0 == (lysc_node *)0x0) {
        plVar10->prev = *(lysc_node **)(*(long *)(node + 1) + 0x20);
        plVar11 = *(lysc_node **)(node + 1);
        plVar10->next = plVar11;
        pplVar17 = &plVar11->prev;
      }
      else {
        plVar10->prev = local_a0;
        plVar11 = local_a0->next;
        plVar10->next = plVar11;
        if (plVar11 == (lysc_node *)0x0) {
          plVar11 = *(lysc_node **)(node + 1);
        }
        pplVar17 = &local_a0->next;
        plVar11->prev = plVar10;
      }
      *pplVar17 = plVar10;
      if (plVar10->prev->next == (lysc_node *)0x0) {
        *(lysc_node **)(node + 1) = plVar10;
      }
    }
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    plVar18 = plVar25;
  }
  LVar2 = lys_compile_node_augments(ctx,node);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  plVar18 = local_a8;
  if (local_a8[2].parent != (lysp_node *)0x0) {
    plVar25 = local_a8[2].parent;
    for (local_68 = (lysp_ext_instance *)0x0; local_68 < plVar25[-1].exts;
        local_68 = (lysp_ext_instance *)((long)&local_68->name + 1)) {
      pcVar8 = node[1].name;
      if (pcVar8 == (char *)0x0) {
        plVar5 = (long *)malloc(0x10);
        if (plVar5 == (long *)0x0) {
LAB_00148885:
          plVar20 = ctx->ctx;
          pcVar8 = "lys_compile_node_list_unique";
          goto LAB_00147e44;
        }
        *plVar5 = 1;
        local_60 = 1;
      }
      else {
        lVar26 = *(long *)(pcVar8 + -8);
        *(long *)(pcVar8 + -8) = lVar26 + 1;
        plVar5 = (long *)realloc(pcVar8 + -8,lVar26 * 8 + 0x10);
        if (plVar5 == (long *)0x0) {
          *(long *)(node[1].name + -8) = *(long *)(node[1].name + -8) + -1;
          plVar20 = ctx->ctx;
          pcVar8 = "lys_compile_node_list_unique";
          goto LAB_00147e44;
        }
        local_60 = *plVar5;
      }
      local_70 = plVar5 + 1;
      node[1].name = (char *)local_70;
      plVar5[local_60] = 0;
      local_88 = &plVar25->parent + (long)local_68 * 3;
      local_94 = 0xffffffff;
      __s = (&plVar25->parent)[(long)local_68 * 3];
      local_48 = plVar25;
      while (__s != (lysp_node *)0x0) {
        pcVar8 = strpbrk((char *)__s," \t\n");
        if (pcVar8 == (char *)0x0) {
          local_d8 = strlen((char *)__s);
          plVar25 = (lysp_node *)0x0;
        }
        else {
          ppuVar9 = __ctype_b_loc();
          plVar25 = (lysp_node *)(pcVar8 + -1);
          do {
            pplVar24 = &plVar25->parent;
            plVar25 = (lysp_node *)((long)&plVar25->parent + 1);
          } while ((*(byte *)((long)*ppuVar9 + (long)*(char *)((long)pplVar24 + 1) * 2 + 1) & 0x20)
                   != 0);
          local_d8 = (long)pcVar8 - (long)__s;
        }
        lVar14 = local_60;
        lVar26 = local_70[local_60 + -1];
        if (lVar26 == 0) {
          plVar5 = (long *)malloc(0x10);
          if (plVar5 == (long *)0x0) goto LAB_00148885;
          *plVar5 = 1;
          local_b8 = 1;
        }
        else {
          lVar22 = *(long *)(lVar26 + -8);
          *(long *)(lVar26 + -8) = lVar22 + 1;
          plVar5 = (long *)realloc((void *)(lVar26 + -8),lVar22 * 8 + 0x10);
          if (plVar5 == (long *)0x0) {
            *(long *)(local_70[lVar14 + -1] + -8) = *(long *)(local_70[lVar14 + -1] + -8) + -1;
            goto LAB_00148885;
          }
          local_b8 = *plVar5;
        }
        local_90 = plVar5 + 1;
        local_70[lVar14 + -1] = (long)local_90;
        local_40 = local_88[1];
        plVar5[local_b8] = 0;
        id = (char *)__s;
        if (node == (lysc_node *)0x0) {
          if (*(char *)&__s->parent != '/') {
            plVar20 = ctx->ctx;
            if (local_d8 == 0) {
              local_d8 = strlen((char *)__s);
            }
            pcVar8 = "Invalid absolute-schema-nodeid value \"%.*s\" - missing starting \"/\".";
            goto LAB_00148972;
          }
          id = (char *)((long)&__s->parent + 1);
          local_c8 = "absolute";
        }
        else {
          local_c8 = "descendant";
          if (*(char *)&__s->parent == '/') {
            plVar20 = ctx->ctx;
            if (local_d8 == 0) {
              local_d8 = strlen((char *)__s);
            }
            pcVar8 = 
            "Invalid descendant-schema-nodeid value \"%.*s\" - absolute-schema-nodeid used.";
            goto LAB_00148972;
          }
        }
        local_38 = local_d8 - 1;
        local_a0 = (lysc_node *)((ulong)local_a0 & 0xffffffff00000000);
        bVar16 = false;
        LVar2 = LY_EVALID;
        local_b0 = (ly_ctx *)((ulong)local_b0 & 0xffffffff00000000);
        uVar4 = 0;
        plVar10 = node;
        for (; *id != '\0'; id = id + 1) {
          LVar2 = ly_parse_nodeid(&id,&prefix,(size_t *)&local_58,&name,&name_len);
          if (LVar2 != LY_SUCCESS) goto LAB_00148548;
          if (prefix == (char *)0x0) {
            plVar12 = ctx->cur_mod;
          }
          else {
            plVar12 = ly_resolve_prefix(ctx->ctx,prefix,CONCAT44(uStack_54,local_58),LY_VALUE_SCHEMA
                                        ,local_40);
            if (plVar12 == (lys_module *)0x0) {
              if (prefix == (char *)0x0) {
                __assert_fail("prefix",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                              ,0xc79,
                              "LY_ERR lysc_resolve_schema_nodeid(struct lysc_ctx *, const char *, size_t, const struct lysc_node *, LY_VALUE_FORMAT, void *, uint16_t, const struct lysc_node **, uint16_t *)"
                             );
              }
              plVar20 = ctx->ctx;
              uVar21 = (ulong)(uint)((int)id - (int)__s);
              pcVar8 = 
              "Invalid %s-schema-nodeid value \"%.*s\" - prefix \"%.*s\" not defined in module \"%s\"."
              ;
              goto LAB_00148838;
            }
          }
          if (plVar10 == (lysc_node *)0x0) {
            if (ctx->ext == (lysc_ext_instance *)0x0) goto LAB_00148475;
            plVar10 = lysc_ext_find_node(ctx->ext,plVar12,name,name_len,0,5);
LAB_001484a4:
            if (plVar10 == (lysc_node *)0x0) {
LAB_0014875e:
              plVar20 = ctx->ctx;
              uVar21 = (ulong)(uint)((int)id - (int)__s);
              pcVar8 = "Invalid %s-schema-nodeid value \"%.*s\" - target node not found.";
              goto LAB_00148838;
            }
          }
          else {
            if ((plVar10->nodetype & 0x300) == 0) {
LAB_00148475:
              plVar10 = lys_find_child(plVar10,plVar12,name,name_len,0,(uint)local_b0 | 5);
              local_b0 = (ly_ctx *)((ulong)local_b0 & 0xffffffff00000000);
              goto LAB_001484a4;
            }
            if (plVar12 != plVar10->module) goto LAB_0014875e;
            iVar3 = ly_strncmp("input",name,name_len);
            if (iVar3 == 0) {
              plVar10 = (lysc_node *)&plVar10[1].module;
            }
            else {
              iVar3 = ly_strncmp("output",name,name_len);
              if (iVar3 != 0) goto LAB_0014875e;
              plVar10 = (lysc_node *)&plVar10[2].next;
              local_b0 = (ly_ctx *)CONCAT44(local_b0._4_4_,0x10);
            }
          }
          uVar13 = plVar10->nodetype;
          uVar4 = (uint)uVar13;
          if (uVar13 == 0x400) {
            uVar13 = 0x4004;
LAB_001484d6:
            local_a0 = (lysc_node *)CONCAT44(local_a0._4_4_,uVar13 | (uint)local_a0);
          }
          else {
            if (uVar13 == 0x2000) {
              uVar13 = 0x2004;
              goto LAB_001484d6;
            }
            if (uVar13 == 0x1000) {
              uVar13 = 0x1004;
              goto LAB_001484d6;
            }
          }
          if ((*id == '\0') || (local_38 < (ulong)((long)id - (long)__s))) goto LAB_00148525;
          if (*id != '/') {
            plVar20 = ctx->ctx;
            uVar21 = (ulong)((int)((long)id - (long)__s) + 1);
            pcVar8 = 
            "Invalid %s-schema-nodeid value \"%.*s\" - missing \"/\" as node-identifier separator.";
LAB_00148838:
            ly_vlog(plVar20,(char *)0x0,LYVE_REFERENCE,pcVar8,local_c8,uVar21,__s);
            return LY_EVALID;
          }
          LVar2 = LY_SUCCESS;
          bVar16 = true;
        }
        if (bVar16) {
LAB_00148525:
          local_90[local_b8 + -1] = (long)plVar10;
          LVar2 = ~uVar4 * 2 & LY_EDENIED;
          plVar18 = local_a8;
        }
        else {
LAB_00148548:
          plVar18 = local_a8;
          plVar20 = ctx->ctx;
          sVar23 = local_d8;
          if (local_d8 == 0) {
            local_b0 = ctx->ctx;
            sVar23 = strlen((char *)__s);
            plVar20 = local_b0;
          }
          ly_vlog(plVar20,(char *)0x0,LYVE_REFERENCE,
                  "Invalid %s-schema-nodeid value \"%.*s\" - unexpected end of expression.",local_c8
                  ,sVar23,__s);
        }
        plVar5 = local_90;
        if (LVar2 != LY_SUCCESS) {
          if (LVar2 != LY_EDENIED) {
            return LY_EVALID;
          }
          plVar20 = ctx->ctx;
          lys_nodetype2str(*(uint16_t *)local_90[local_b8 + -1]);
          pcVar8 = 
          "Unique\'s descendant-schema-nodeid \"%.*s\" refers to %s node instead of a leaf.";
LAB_00148972:
          ly_vlog(plVar20,(char *)0x0,LYVE_REFERENCE,pcVar8,local_d8,__s);
          return LY_EVALID;
        }
        if ((short)local_a0 != 0) {
          plVar20 = ctx->ctx;
          pcVar8 = "Unique\'s descendant-schema-nodeid \"%.*s\" refers into %s node.";
          goto LAB_00148972;
        }
        plVar10 = (lysc_node *)local_90[local_b8 + -1];
        uVar13 = plVar10->flags;
        if ((local_94 != 0xffffffff) &&
           (((local_94 == 0 & (byte)uVar13) != 0 || (local_94 == 1 && (uVar13 & 2) != 0)))) {
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                  "Unique statement \"%s\" refers to leaves with different config type.",*local_88);
          return LY_EVALID;
        }
        plVar11 = plVar10;
        while (plVar11 = plVar11->parent, plVar11 != node) {
          if (plVar11->nodetype == 0x10) {
            ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                    "Unique statement \"%s\" refers to a leaf in nested list \"%s\".",*local_88,
                    plVar11->name);
            return LY_EVALID;
          }
        }
        local_94 = uVar13 & 1;
        LVar2 = lysc_check_status(ctx,node->flags,local_88[1]->parent,node->name,uVar13,
                                  plVar10->module,plVar10->name);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        *(ushort *)(plVar5[local_b8 + -1] + 2) = *(ushort *)(plVar5[local_b8 + -1] + 2) | 0x80;
        __s = plVar25;
      }
      plVar25 = local_48;
    }
  }
  pplVar24 = (lysp_node **)&plVar18[1].iffeatures;
  do {
    plVar25 = *pplVar24;
    if (plVar25 == (lysp_node *)0x0) {
      pplVar19 = &plVar18[1].exts;
      do {
        plVar6 = *pplVar19;
        if (plVar6 == (lysp_ext_instance *)0x0) {
          if (*(uint *)((long)&node[1].dsc + 4) < *(uint *)&node[1].dsc) {
            ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                    "List min-elements %u is bigger than max-elements %u.");
            return LY_EVALID;
          }
          return LY_SUCCESS;
        }
        LVar2 = lys_compile_node(ctx,(lysp_node *)plVar6,node,0,(ly_set *)0x0);
        pplVar19 = (lysp_ext_instance **)&plVar6->format;
      } while (LVar2 == LY_SUCCESS);
      return LVar2;
    }
    LVar2 = lys_compile_node(ctx,plVar25,node,0,(ly_set *)0x0);
    pplVar24 = &plVar25->next;
  } while (LVar2 == LY_SUCCESS);
  return LVar2;
}

Assistant:

static LY_ERR
lys_compile_node_list(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_list *list_p = (struct lysp_node_list *)pnode;
    struct lysc_node_list *list = (struct lysc_node_list *)node;
    struct lysp_node *child_p;
    struct lysc_node *parent;
    struct lysc_node_leaf *key, *prev_key = NULL;
    size_t len;
    const char *keystr, *delim;
    LY_ERR ret = LY_SUCCESS;

    list->min = list_p->min;
    if (list->min) {
        list->flags |= LYS_MAND_TRUE;
    }
    list->max = list_p->max ? list_p->max : UINT32_MAX;

    LY_LIST_FOR(list_p->child, child_p) {
        LY_CHECK_RET(lys_compile_node(ctx, child_p, node, 0, NULL));
    }

    COMPILE_ARRAY_GOTO(ctx, list_p->musts, list->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    /* keys */
    if (list->flags & LYS_CONFIG_W) {
        parent = node;
        if (ctx->compile_opts & LYS_COMPILE_GROUPING) {
            /* compiling individual grouping, we can check this only if there is an explicit config set */
            while (parent) {
                if (parent->flags & LYS_SET_CONFIG) {
                    break;
                }
                parent = parent->parent;
            }
        }

        if (parent && (!list_p->key || !list_p->key[0])) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Missing key in list representing configuration data.");
            return LY_EVALID;
        }
    }

    /* find all the keys (must be direct children) */
    keystr = list_p->key;
    if (!keystr) {
        /* keyless list */
        list->flags &= ~LYS_ORDBY_SYSTEM;
        list->flags |= LYS_KEYLESS | LYS_ORDBY_USER;
    }
    while (keystr) {
        delim = strpbrk(keystr, " \t\n");
        if (delim) {
            len = delim - keystr;
            while (isspace(*delim)) {
                ++delim;
            }
        } else {
            len = strlen(keystr);
        }

        /* key node must be present */
        key = (struct lysc_node_leaf *)lys_find_child(node, node->module, keystr, len, LYS_LEAF, LYS_GETNEXT_NOCHOICE);
        if (!key) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "The list's key \"%.*s\" not found.", (int)len, keystr);
            return LY_EVALID;
        }
        /* keys must be unique */
        if (key->flags & LYS_KEY) {
            /* the node was already marked as a key */
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Duplicated key identifier \"%.*s\".", (int)len, keystr);
            return LY_EVALID;
        }

        lysc_update_path(ctx, list->module, key->name);
        /* key must have the same config flag as the list itself */
        if ((list->flags & LYS_CONFIG_MASK) != (key->flags & LYS_CONFIG_MASK)) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Key of a configuration list must not be a state leaf.");
            return LY_EVALID;
        }
        if (ctx->pmod->version < LYS_VERSION_1_1) {
            /* YANG 1.0 denies key to be of empty type */
            if (key->type->basetype == LY_TYPE_EMPTY) {
                LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                        "List key of the \"empty\" type is allowed only in YANG 1.1 modules.");
                return LY_EVALID;
            }
        } else {
            /* when and if-feature are illegal on list keys */
            if (key->when) {
                LOGVAL(ctx->ctx, LYVE_SEMANTICS, "List's key must not have any \"when\" statement.");
                return LY_EVALID;
            }
            /* unable to check if-features but compilation would fail if disabled */
        }

        /* check status */
        LY_CHECK_RET(lysc_check_status(ctx, list->flags, list->module, list->name, key->flags, key->module, key->name));

        /* ignore default values of the key */
        if (key->dflt) {
            key->dflt->realtype->plugin->free(ctx->ctx, key->dflt);
            lysc_type_free(&ctx->free_ctx, (struct lysc_type *)key->dflt->realtype);
            free(key->dflt);
            key->dflt = NULL;
        }
        /* mark leaf as key */
        key->flags |= LYS_KEY;

        /* move it to the correct position */
        if ((prev_key && ((struct lysc_node *)prev_key != key->prev)) || (!prev_key && key->prev->next)) {
            /* fix links in closest previous siblings of the key */
            if (key->next) {
                key->next->prev = key->prev;
            } else {
                /* last child */
                list->child->prev = key->prev;
            }
            if (key->prev->next) {
                key->prev->next = key->next;
            }
            /* fix links in the key */
            if (prev_key) {
                key->prev = &prev_key->node;
                key->next = prev_key->next;
            } else {
                key->prev = list->child->prev;
                key->next = list->child;
            }
            /* fix links in closes future siblings of the key */
            if (prev_key) {
                if (prev_key->next) {
                    prev_key->next->prev = &key->node;
                } else {
                    list->child->prev = &key->node;
                }
                prev_key->next = &key->node;
            } else {
                list->child->prev = &key->node;
            }
            /* fix links in parent */
            if (!key->prev->next) {
                list->child = &key->node;
            }
        }

        /* next key value */
        prev_key = key;
        keystr = delim;
        lysc_update_path(ctx, NULL, NULL);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    /* uniques */
    if (list_p->uniques) {
        LY_CHECK_RET(lys_compile_node_list_unique(ctx, list_p->uniques, list));
    }

    LY_LIST_FOR((struct lysp_node *)list_p->actions, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }
    LY_LIST_FOR((struct lysp_node *)list_p->notifs, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

    /* checks */
    if (list->min > list->max) {
        LOGVAL(ctx->ctx, LYVE_SEMANTICS, "List min-elements %" PRIu32 " is bigger than max-elements %" PRIu32 ".",
                list->min, list->max);
        return LY_EVALID;
    }

done:
    return ret;
}